

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O2

int zapyourself(obj *obj,boolean ordinary)

{
  short sVar1;
  obj *poVar2;
  bool bVar3;
  boolean bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  obj **ppoVar8;
  char *pcVar9;
  char *line;
  int y;
  bool bVar10;
  obj *local_130;
  char buf [256];
  
  sVar1 = obj->otyp;
  switch(sVar1) {
  case 0x17d:
  case 0x18c:
  case 0x194:
  case 0x1c3:
  case 0x1cd:
  case 0x1cf:
    break;
  case 0x17e:
    goto switchD_0027df5c_caseD_17e;
  case 0x17f:
    pline("You explode a fireball on top of yourself!");
    iVar5 = (int)u.ux;
    y = (int)u.uy;
    iVar6 = dice(6,6);
    explode(iVar5,y,0xb,iVar6,'\v',5);
    break;
  case 0x180:
    goto switchD_0027df5c_caseD_180;
  case 0x181:
    goto switchD_0027df5c_caseD_181;
  case 0x182:
  case 0x1d4:
    if ((((youmonst.data)->mlet != '7') && (((youmonst.data)->mflags2 & 2) == 0)) &&
       ((youmonst.data != mons + 0x33 && (youmonst.data)->mlet != '\x16') &&
        ((youmonst.data)->mflags2 >> 9 & 1) == 0)) {
      sprintf(buf,"shot %sself with a death ray",genders[flags.female != '\0'].him);
      killer_format = 2;
      killer = buf;
      pline("You irradiate yourself with pure energy!");
      pline("You die.");
      discover_object((int)obj->otyp,'\x01','\x01');
      done(0);
      return 0;
    }
    pcVar9 = "You seem no deader than before.";
    if (sVar1 == 0x1d4) {
      pcVar9 = "The wand shoots an apparently harmless beam at you.";
    }
    goto LAB_0027e89c;
  case 0x183:
  case 0x184:
  case 0x188:
  case 0x189:
  case 0x18d:
  case 0x18e:
  case 399:
  case 400:
  case 0x191:
  case 0x192:
  case 0x193:
  case 0x195:
  case 0x197:
  case 0x198:
  case 0x199:
  case 0x19a:
  case 0x19b:
  case 0x19c:
  case 0x1a0:
  case 0x1a2:
  case 0x1a3:
  case 0x1a5:
  case 0x1a6:
  case 0x1a7:
  case 0x1a8:
  case 0x1a9:
  case 0x1aa:
  case 0x1ab:
  case 0x1ac:
  case 0x1ad:
  case 0x1ae:
  case 0x1af:
  case 0x1b0:
  case 0x1b1:
  case 0x1b2:
  case 0x1b3:
  case 0x1b4:
  case 0x1b5:
  case 0x1b6:
  case 0x1b7:
  case 0x1b8:
  case 0x1b9:
  case 0x1ba:
  case 0x1bb:
  case 0x1bc:
  case 0x1bd:
  case 0x1bf:
  case 0x1c0:
  case 0x1c1:
  case 0x1c2:
switchD_0027df5c_caseD_183:
    warning("object %d used?",(ulong)(uint)(int)sVar1);
    break;
  case 0x185:
  case 0x196:
    iVar6 = dice(6,(uint)(sVar1 == 0x196) * 4 + 4);
    healup(iVar6,0,'\0',obj->otyp == 0x196);
    pcVar9 = "";
    if (obj->otyp == 0x196) {
      pcVar9 = "much ";
    }
    line = "You feel %sbetter.";
LAB_0027e0f5:
    pline(line,pcVar9);
    break;
  case 0x186:
    goto switchD_0027df5c_caseD_186;
  case 0x187:
    goto switchD_0027df5c_caseD_187;
  case 0x18a:
    if (u.uprops[0x35].extrinsic != 0 || u.uprops[0x35].intrinsic != 0) {
      return 0;
    }
    bVar4 = resists_drli(&youmonst);
    if (bVar4 != '\0') {
      return 0;
    }
    losexp("life drainage");
    goto LAB_0027e091;
  case 0x18b:
  case 0x1c6:
    if ((u.uprops[0x1a].intrinsic & 0x7ffffff) == 0) {
      return 0;
    }
    u_slow_down();
LAB_0027e091:
    discover_object((int)obj->otyp,'\x01','\x01');
    break;
  case 0x19d:
    goto switchD_0027df5c_caseD_19d;
  case 0x19e:
    goto switchD_0027df5c_caseD_19e;
  case 0x19f:
  case 0x1cb:
    tele((char *)0x0);
    break;
  case 0x1a1:
  case 0x1ca:
    cancel_monst(&youmonst,obj,'\x01','\0','\x01');
    break;
  case 0x1a4:
    if (u.umonnum == 0x108) {
      polymon(0x106);
    }
    buf._0_8_ = invent;
    if (u.uprops[0x21].intrinsic != 0) {
      fix_petrification();
      buf._0_8_ = invent;
    }
    while ((obj *)buf._0_8_ != (obj *)0x0) {
      poVar2 = ((obj *)buf._0_8_)->nobj;
      local_130 = poVar2;
      bhito((obj *)buf._0_8_,obj);
      buf._0_8_ = poVar2;
    }
    ppoVar8 = &invent;
    bVar10 = false;
LAB_0027e39b:
    do {
      bVar3 = bVar10;
      local_130 = *ppoVar8;
      buf._0_8_ = local_130;
      if (local_130 != (obj *)0x0 && !bVar3) {
        do {
          local_130 = local_130->nobj;
          if (local_130 == (obj *)0x0) {
            ppoVar8 = (obj **)buf._0_8_;
            bVar10 = false;
            goto LAB_0027e39b;
          }
          iVar6 = merged((obj **)buf,&local_130);
        } while (iVar6 == 0);
        ppoVar8 = (obj **)buf._0_8_;
        bVar10 = true;
        goto LAB_0027e39b;
      }
      ppoVar8 = &invent;
      bVar10 = false;
    } while (bVar3);
    break;
  case 0x1be:
    iVar6 = dice((int)obj->spe,0x19);
LAB_0027e1b1:
    iVar5 = rnd(0x19);
    bVar4 = resists_blnd(&youmonst);
    if (bVar4 != '\0') {
      return 0;
    }
    pline("You are blinded by the flash!");
    make_blinded((long)(iVar5 + iVar6),'\0');
    discover_object((int)obj->otyp,'\x01','\x01');
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0027e226;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0027e21d;
    }
    else {
LAB_0027e21d:
      if (ublindf == (obj *)0x0) {
        return 0;
      }
LAB_0027e226:
      if (ublindf->oartifact != '\x1d') {
        return 0;
      }
    }
    pcVar9 = "Your vision quickly clears.";
    goto LAB_0027e89c;
  case 0x1c4:
    discover_object(0x1c4,'\x01','\x01');
switchD_0027df5c_caseD_187:
    if ((u.uprops[0x2c].extrinsic == 0) &&
       ((u.umonnum == u.umonster || (bVar4 = resists_magm(&youmonst), bVar4 == '\0')))) {
      if (ordinary == '\0') {
        iVar6 = obj->spe + 1;
        iVar5 = 6;
      }
      else {
        pline("You bash yourself!");
        iVar6 = 2;
        iVar5 = 0xc;
      }
      iVar6 = dice(iVar6,iVar5);
      exercise(0,'\0');
      return iVar6;
    }
    shieldeff(u.ux,u.uy);
    pcVar9 = "Boing!";
    goto LAB_0027e89c;
  case 0x1c5:
    if (u.uprops[0xd].blocked == 0 &&
        ((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
        (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0))) {
      bVar10 = false;
    }
    else {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0027e481;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0027e47c;
LAB_0027e960:
        bVar10 = u.uprops[0xd].blocked == 0;
      }
      else {
LAB_0027e47c:
        if (ublindf != (obj *)0x0) {
LAB_0027e481:
          if (ublindf->oartifact == '\x1d') goto LAB_0027e960;
        }
        bVar10 = false;
      }
      if ((u.uprops[0xd].blocked != 0) && (uarmc->otyp == 0x7c)) {
        pcVar9 = xname(uarmc);
        line = "You feel rather itchy under your %s.";
        goto LAB_0027e0f5;
      }
    }
    if ((ordinary == '\0') && (uVar7 = mt_random(), uVar7 % 10 != 0)) {
      iVar6 = dice((int)obj->spe,0xfa);
      incr_itimeout(&u.uprops[0xd].intrinsic,(long)iVar6);
    }
    else {
      u.uprops[0xd].intrinsic = u.uprops[0xd].intrinsic | 0x4000000;
    }
    if (bVar10) {
      discover_object(0x1c5,'\x01','\x01');
      newsym((int)u.ux,(int)u.uy);
      self_invis_message();
    }
    break;
  case 0x1c7:
    if ((u.uprops[0x1a].intrinsic & 0x7000000) == 0) {
      pcVar9 = "You speed up.";
      if (u.uprops[0x1a].intrinsic != 0 || u.uprops[0x1a].extrinsic != 0) {
        pcVar9 = "Your quickness feels more natural.";
      }
      pline(pcVar9);
      discover_object(0x1c7,'\x01','\x01');
      exercise(3,'\x01');
    }
    u.uprops[0x1a].intrinsic = u.uprops[0x1a].intrinsic | 0x4000000;
    break;
  case 0x1c8:
    discover_object(0x1c8,'\x01','\x01');
switchD_0027df5c_caseD_19d:
    unturn_dead(&youmonst);
    if (((youmonst.data)->mflags2 & 2) != 0) {
      pline("You feel frightened and %sstunned.");
      uVar7 = u.uprops[0x1b].intrinsic;
      iVar6 = rnd(0x1e);
      make_stunned((ulong)(uVar7 + iVar6),'\0');
      return 0;
    }
    pcVar9 = "You shudder in dread.";
    goto LAB_0027e89c;
  case 0x1c9:
    if (u.uprops[0x3d].extrinsic == 0 && u.uprops[0x3d].intrinsic == 0) {
      discover_object(0x1c9,'\x01','\x01');
    }
switchD_0027df5c_caseD_19e:
    if (u.uprops[0x3d].extrinsic == 0 && u.uprops[0x3d].intrinsic == 0) {
      polyself('\0');
    }
    break;
  case 0x1cc:
    if (uball == (obj *)0x0) {
      return 0;
    }
    discover_object(0x1cc,'\x01','\x01');
switchD_0027df5c_caseD_186:
    if (uball == (obj *)0x0) {
      return 0;
    }
    pcVar9 = "Your chain quivers for a moment.";
    goto LAB_0027e89c;
  case 0x1ce:
    if (u.umonnum != u.umonster) {
      discover_randomized_dragon(youmonst.data,"You discover that you are %s.");
    }
    ppoVar8 = &invent;
    while (ppoVar8 = &((obj *)ppoVar8)->nobj->nobj, (obj *)ppoVar8 != (obj *)0x0) {
      ((obj *)ppoVar8)->field_0x4a = ((obj *)ppoVar8)->field_0x4a | 0x20;
    }
    discover_object(0x1ce,'\x01','\x01');
    ustatusline();
    break;
  case 0x1d0:
    discover_object(0x1d0,'\x01','\x01');
switchD_0027df5c_caseD_17e:
    pline("You\'ve shot yourself!");
    sprintf(buf,"shot %sself with a magic missile",genders[flags.female != '\0'].him);
    iVar6 = dice(4,6);
    mana_damageu(iVar6,(monst *)0x0,buf,2,'\x01');
    break;
  case 0x1d1:
    discover_object(0x1d1,'\x01','\x01');
LAB_0027e51f:
    pline("You\'ve set yourself afire!");
    sprintf(buf,"shot %sself with a bolt of fire",genders[flags.female != '\0'].him);
    iVar6 = dice(0xc,6);
    fire_damageu(iVar6,(monst *)0x0,buf,2,0x14,'\x01','\0');
    break;
  case 0x1d2:
    discover_object(0x1d2,'\x01','\x01');
    goto switchD_0027df5c_caseD_180;
  case 0x1d3:
    discover_object(0x1d3,'\x01','\x01');
switchD_0027df5c_caseD_181:
    if ((((u.uprops[3].intrinsic == 0 && u.uprops[3].extrinsic == 0) ||
         (((u.uprops[3].intrinsic >> 0x1a & 1) != 0 &&
          ((u.uprops[3].intrinsic & 0xfbffffff) == 0 && u.uprops[3].extrinsic == 0)))) &&
        (((byte)youmonst.mintrinsics & 4) == 0)) && (u.uprops[0x38].extrinsic == 0)) {
      pline("The sleep ray hits you!");
      iVar6 = 0x32;
      if ((((u.uprops[3].intrinsic >> 0x1a & 1) != 0) &&
          ((u.uprops[3].intrinsic & 0xfbffffff) == 0 && u.uprops[3].extrinsic == 0)) &&
         ((((byte)youmonst.mintrinsics & 4) == 0 && (u.uprops[0x38].extrinsic == 0)))) {
        iVar6 = 0x19;
      }
      iVar6 = rnd(iVar6);
      fall_asleep(-iVar6,'\x01');
      return 0;
    }
    shieldeff(u.ux,u.uy);
    pcVar9 = "You don\'t feel sleepy!";
LAB_0027e89c:
    pline(pcVar9);
    break;
  case 0x1d5:
    discover_object(0x1d5,'\x01','\x01');
    pline("You shock yourself!");
    sprintf(buf,"show %sself with a bolt of lightning",genders[flags.female != '\0'].him);
    iVar6 = dice(0xc,6);
    elec_damageu(iVar6,(monst *)0x0,buf,2,0x14,'\x01');
    break;
  default:
    iVar6 = 0;
    if (sVar1 == 0xea) goto LAB_0027e1b1;
    if (sVar1 != 0xff) {
      if (sVar1 == 0x100) goto LAB_0027e51f;
      goto switchD_0027df5c_caseD_183;
    }
switchD_0027df5c_caseD_180:
    pline("You imitate a popsicle!");
    pcVar9 = "bolt";
    if (obj->otyp == 0x180) {
      pcVar9 = "cone";
    }
    sprintf(buf,"shot %sself with a %s of cold",genders[flags.female != '\0'].him,pcVar9);
    iVar6 = dice(0xc,6);
    cold_damageu(iVar6,(monst *)0x0,buf,2,0x14);
  }
  return 0;
}

Assistant:

int zapyourself(struct obj *obj, boolean ordinary)
{
	int	damage = 0;
	char buf[BUFSZ];

	switch(obj->otyp) {
		case WAN_STRIKING:
		    makeknown(WAN_STRIKING);
		case SPE_FORCE_BOLT:
		    if (Antimagic) {
			shieldeff(u.ux, u.uy);
			pline("Boing!");
		    } else {
			if (ordinary) {
			    pline("You bash yourself!");
			    damage = dice(2,12);
			} else
			    damage = dice(1 + obj->spe,6);
			exercise(A_STR, FALSE);
		    }
		    break;

		case WAN_LIGHTNING:
		    makeknown(WAN_LIGHTNING);
		    pline("You shock yourself!");
		    sprintf(buf, "show %sself with a bolt of lightning", uhim());
		    elec_damageu(dice(12, 6), NULL, buf, NO_KILLER_PREFIX, 20, TRUE);
		    break;

		case SPE_FIREBALL:
		    pline("You explode a fireball on top of yourself!");
		    explode(u.ux, u.uy, 11, dice(6,6), WAND_CLASS, EXPL_FIERY);
		    break;
		case WAN_FIRE:
		    makeknown(WAN_FIRE);
		case FIRE_HORN:
		    pline("You've set yourself afire!");
		    sprintf(buf, "shot %sself with a bolt of fire", uhim());
		    fire_damageu(dice(12, 6), NULL, buf, NO_KILLER_PREFIX,
				 20, TRUE, FALSE);
		    break;

		case WAN_COLD:
		    makeknown(WAN_COLD);
		case SPE_CONE_OF_COLD:
		case FROST_HORN:
		    pline("You imitate a popsicle!");
		    sprintf(buf, "shot %sself with a %s of cold", uhim(),
			    obj->otyp == SPE_CONE_OF_COLD ? "cone" : "bolt");
		    cold_damageu(dice(12, 6), NULL, buf, NO_KILLER_PREFIX, 20);
		    break;

		case WAN_MAGIC_MISSILE:
		    makeknown(WAN_MAGIC_MISSILE);
		case SPE_MAGIC_MISSILE:
		    pline("You've shot yourself!");
		    sprintf(buf, "shot %sself with a magic missile", uhim());
		    mana_damageu(dice(4, 6), NULL, buf, NO_KILLER_PREFIX, TRUE);
		    break;

		case WAN_POLYMORPH:
		    if (!Unchanging)
		    	makeknown(WAN_POLYMORPH);
		case SPE_POLYMORPH:
		    if (!Unchanging)
		    	polyself(FALSE);
		    break;

		case WAN_CANCELLATION:
		case SPE_CANCELLATION:
		    cancel_monst(&youmonst, obj, TRUE, FALSE, TRUE);
		    break;

		case SPE_DRAIN_LIFE:
			if (!Drain_resistance) {
				losexp("life drainage");
				makeknown(obj->otyp);
			}
			damage = 0;	/* No additional damage */
			break;

		case WAN_MAKE_INVISIBLE: {
		    /* have to test before changing HInvis but must change
		     * HInvis before doing newsym().
		     */
		    int msg = !Invis && !Blind && !BInvis;

		    if (BInvis && uarmc->otyp == MUMMY_WRAPPING) {
			/* A mummy wrapping absorbs it and protects you */
		        pline("You feel rather itchy under your %s.", xname(uarmc));
		        break;
		    }
		    if (ordinary || !rn2(10)) {	/* permanent */
			HInvis |= FROMOUTSIDE;
		    } else {			/* temporary */
		    	incr_itimeout(&HInvis, dice(obj->spe, 250));
		    }
		    if (msg) {
			makeknown(WAN_MAKE_INVISIBLE);
			newsym(u.ux, u.uy);
			self_invis_message();
		    }
		    break;
		}

		case WAN_SPEED_MONSTER:
		    if (!(HFast & INTRINSIC)) {
			if (!Fast)
			    pline("You speed up.");
			else
			    pline("Your quickness feels more natural.");
			makeknown(WAN_SPEED_MONSTER);
			exercise(A_DEX, TRUE);
		    }
		    HFast |= FROMOUTSIDE;
		    break;

		case WAN_SLEEP:
		    makeknown(WAN_SLEEP);
		case SPE_SLEEP:
		    if (FSleep_resistance) {
			shieldeff(u.ux, u.uy);
			pline("You don't feel sleepy!");
		    } else {
			pline("The sleep ray hits you!");
			fall_asleep(-rnd(PSleep_resistance ? 25 : 50), TRUE);
		    }
		    break;

		case WAN_SLOW_MONSTER:
		case SPE_SLOW_MONSTER:
		    if (HFast & (TIMEOUT | INTRINSIC)) {
			u_slow_down();
			makeknown(obj->otyp);
		    }
		    break;

		case WAN_TELEPORTATION:
		case SPE_TELEPORT_AWAY:
		    tele(NULL);
		    break;

		case WAN_DEATH:
		case SPE_FINGER_OF_DEATH:
		    if (nonliving(youmonst.data) || is_demon(youmonst.data)) {
			pline((obj->otyp == WAN_DEATH) ?
			  "The wand shoots an apparently harmless beam at you."
			  : "You seem no deader than before.");
			break;
		    }
		    sprintf(buf, "shot %sself with a death ray", uhim());
		    killer = buf;
		    killer_format = NO_KILLER_PREFIX;
		    pline("You irradiate yourself with pure energy!");
		    pline("You die.");
		    makeknown(obj->otyp);
			/* They might survive with an amulet of life saving */
		    done(DIED);
		    break;
		case WAN_UNDEAD_TURNING:
		    makeknown(WAN_UNDEAD_TURNING);
		case SPE_TURN_UNDEAD:
		    unturn_dead(&youmonst);
		    if (is_undead(youmonst.data)) {
			pline("You feel frightened and %sstunned.",
			     Stunned ? "even more " : "");
			make_stunned(HStun + rnd(30), FALSE);
		    } else
			pline("You shudder in dread.");
		    break;
		case SPE_HEALING:
		case SPE_EXTRA_HEALING:
		    healup(dice(6, obj->otyp == SPE_EXTRA_HEALING ? 8 : 4),
			   0, FALSE, (obj->otyp == SPE_EXTRA_HEALING));
		    pline("You feel %sbetter.",
			obj->otyp == SPE_EXTRA_HEALING ? "much " : "");
		    break;
		case WAN_LIGHT:	/* (broken wand) */
		 /* assert( !ordinary ); */
		    damage = dice(obj->spe, 25);
		case EXPENSIVE_CAMERA:
		    damage += rnd(25);
		    if (!resists_blnd(&youmonst)) {
			pline(blinded_by_the_flash);
			make_blinded((long)damage, FALSE);
			makeknown(obj->otyp);
			if (!Blind) pline("Your vision quickly clears.");
		    }
		    damage = 0;	/* reset */
		    break;
		case WAN_OPENING:
		    if (Punished) makeknown(WAN_OPENING);
		case SPE_KNOCK:
		    if (Punished) pline("Your chain quivers for a moment.");
		    break;
		case WAN_DIGGING:
		case SPE_DIG:
		case SPE_DETECT_UNSEEN:
		case WAN_NOTHING:
		case WAN_LOCKING:
		case SPE_WIZARD_LOCK:
		    break;
		case WAN_PROBING:
		    if (Upolyd) {
			discover_randomized_dragon(youmonst.data,
				"You discover that you are %s.");
		    }
		    for (obj = invent; obj; obj = obj->nobj)
			obj->dknown = 1;
		    /* note: `obj' reused; doesn't point at wand anymore */
		    makeknown(WAN_PROBING);
		    ustatusline();
		    break;
		case SPE_STONE_TO_FLESH:
		    {
		    struct obj *otemp, *onext;
		    boolean didmerge;

		    if (u.umonnum == PM_STONE_GOLEM)
			polymon(PM_FLESH_GOLEM);
		    if (Stoned) fix_petrification();	/* saved! */
		    /* but at a cost.. */
		    for (otemp = invent; otemp; otemp = onext) {
			onext = otemp->nobj;
			bhito(otemp, obj);
			}
		    /*
		     * It is possible that we can now merge some inventory.
		     * Do a higly paranoid merge.  Restart from the beginning
		     * until no merges.
		     */
		    do {
			didmerge = FALSE;
			for (otemp = invent; !didmerge && otemp; otemp = otemp->nobj)
			    for (onext = otemp->nobj; onext; onext = onext->nobj)
			    	if (merged(&otemp, &onext)) {
			    		didmerge = TRUE;
			    		break;
			    		}
		    } while (didmerge);
		    }
		    break;
		default: warning("object %d used?",obj->otyp);
		    break;
	}
	return damage;
}